

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<slang::Diagnostic,_2UL>::SmallVector
          (SmallVector<slang::Diagnostic,_2UL> *this,Base *other)

{
  bool bVar1;
  move_iterator<slang::Diagnostic_*> last;
  move_iterator<slang::Diagnostic_*> this_00;
  Diagnostic *pDVar2;
  unsigned_long uVar3;
  move_iterator<slang::Diagnostic_*> in_RSI;
  SmallVectorBase<slang::Diagnostic> *in_RDI;
  Diagnostic *in_stack_ffffffffffffff98;
  SmallVectorBase<slang::Diagnostic> *in_stack_ffffffffffffffa0;
  
  SmallVectorBase<slang::Diagnostic>::SmallVectorBase(in_RDI);
  bVar1 = SmallVectorBase<slang::Diagnostic>::isSmall
                    ((SmallVectorBase<slang::Diagnostic> *)in_RSI._M_current);
  if (bVar1) {
    in_RDI->cap = 2;
    SmallVectorBase<slang::Diagnostic>::begin
              ((SmallVectorBase<slang::Diagnostic> *)in_RSI._M_current);
    last = std::make_move_iterator<slang::Diagnostic*>(in_stack_ffffffffffffff98);
    SmallVectorBase<slang::Diagnostic>::end((SmallVectorBase<slang::Diagnostic> *)in_RSI._M_current)
    ;
    this_00 = std::make_move_iterator<slang::Diagnostic*>(in_stack_ffffffffffffff98);
    SmallVectorBase<slang::Diagnostic>::append<std::move_iterator<slang::Diagnostic_*>_>
              ((SmallVectorBase<slang::Diagnostic> *)this_00._M_current,in_RSI,last);
    SmallVectorBase<slang::Diagnostic>::clear(in_stack_ffffffffffffffa0);
  }
  else {
    pDVar2 = std::exchange<slang::Diagnostic*,decltype(nullptr)>
                       (&in_stack_ffffffffffffffa0->data_,(void **)in_stack_ffffffffffffff98);
    in_RDI->data_ = pDVar2;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->len = uVar3;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->cap = uVar3;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }